

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreplyhttpimpl_p.cpp
# Opt level: O3

void QNetworkReplyHttpImpl::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  char *pcVar3;
  DataPointer d;
  char cVar4;
  undefined8 *puVar5;
  InterfaceType *pIVar6;
  int iVar7;
  qint64 maxSize;
  QNetworkReplyHttpImplPrivate *pQVar8;
  long in_FS_OFFSET;
  QArrayData *pQVar9;
  undefined8 local_30;
  void *local_28;
  undefined8 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 0xc:
    case 0x11:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
LAB_0021a71e:
        *puVar5 = pIVar6;
        goto switchD_0021a5aa_default;
      }
      break;
    default:
      puVar5 = (undefined8 *)*_a;
      break;
    case 0x10:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QHttpNetworkRequest>::metaType;
        goto LAB_0021a71e;
      }
      break;
    case 0x13:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
        goto LAB_0021a71e;
      }
      break;
    case 0x14:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslConfiguration>::metaType;
        goto LAB_0021a71e;
      }
      break;
    case 0x15:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_0021a71e;
      }
      break;
    case 0x16:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkProxy>::metaType;
        goto LAB_0021a71e;
      }
    }
    *puVar5 = 0;
    goto switchD_0021a5aa_default;
  }
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == startHttpRequest && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == abortHttpRequest && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == readBufferSizeChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == readBufferFreed && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar1 == startHttpRequestSynchronously && lVar2 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar1 == haveUploadData && lVar2 == 0) {
      *(undefined4 *)*_a = 5;
    }
    goto switchD_0021a5aa_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_0021a5aa_default;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      iVar7 = 0;
LAB_0021a9ba:
      QMetaObject::activate(_o,&staticMetaObject,iVar7,(void **)0x0);
      return;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      iVar7 = 1;
      goto LAB_0021a9ba;
    }
    break;
  case 2:
    local_30 = *_a[1];
    iVar7 = 2;
    goto LAB_0021a94d;
  case 3:
    local_30 = *_a[1];
    iVar7 = 3;
LAB_0021a94d:
    local_20 = &local_30;
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar7,&local_28);
  default:
switchD_0021a5aa_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      iVar7 = 4;
      goto LAB_0021a9ba;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      haveUploadData((QNetworkReplyHttpImpl *)_o,*_a[1],(QByteArray *)_a[2],*_a[3],*_a[4]);
      return;
    }
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::_q_startOperation(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::_q_cacheLoadReadyRead
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::_q_bufferOutgoingData
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::_q_bufferOutgoingDataFinished
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      (**(code **)(**(long **)(*(long *)(_o + 8) + 8) + 0xf0))();
      return;
    }
    break;
  case 0xb:
    pQVar8 = *(QNetworkReplyHttpImplPrivate **)(_o + 8);
LAB_0021a902:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::finished(pQVar8);
      return;
    }
    break;
  case 0xc:
  case 0x11:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::error
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1],(QString *)_a[2]);
      return;
    }
    break;
  case 0xd:
    pQVar8 = *(QNetworkReplyHttpImplPrivate **)(_o + 8);
    pQVar9 = &((DataPointer *)_a[1])->d->super_QArrayData;
    d = *(DataPointer *)_a[1];
    if (pQVar9 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&pQVar9->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar9->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QNetworkReplyHttpImplPrivate::replyDownloadData(pQVar8,(QByteArray)d);
    if (pQVar9 != (QArrayData *)0x0) {
      LOCK();
      (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar9,1,0x10);
      }
    }
    goto switchD_0021a5aa_default;
  case 0xe:
    pQVar8 = *(QNetworkReplyHttpImplPrivate **)(_o + 8);
    if (pQVar8->loadingFromCache == false) goto LAB_0021a902;
    goto switchD_0021a5aa_default;
  case 0xf:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::replyDownloadProgressSlot
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1],*_a[2]);
      return;
    }
    break;
  case 0x10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::httpAuthenticationRequired
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QHttpNetworkRequest *)_a[1],*_a[2]);
      return;
    }
    break;
  case 0x12:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReply::encrypted(*(QNetworkReply **)(*(long *)(_o + 8) + 8));
      return;
    }
    break;
  case 0x13:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::replySslErrors
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QList<QSslError> *)_a[1],*_a[2],*_a[3])
      ;
      return;
    }
    break;
  case 0x14:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::replySslConfigurationChanged
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QSslConfiguration *)_a[1]);
      return;
    }
    break;
  case 0x15:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReply::preSharedKeyAuthenticationRequired
                (*(QNetworkReply **)(*(long *)(_o + 8) + 8),*_a[1]);
      return;
    }
    break;
  case 0x16:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::proxyAuthenticationRequired
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QNetworkProxy *)_a[1],*_a[2]);
      return;
    }
    break;
  case 0x17:
    lVar2 = *(long *)(_o + 8);
    pcVar3 = *_a[1];
    cVar4 = (**(code **)(**(long **)(lVar2 + 0x278) + 0x80))();
    *pcVar3 = cVar4;
    if (cVar4 != '\0') {
      *(undefined8 *)(lVar2 + 0x288) = 0;
    }
    goto switchD_0021a5aa_default;
  case 0x18:
    pQVar8 = *(QNetworkReplyHttpImplPrivate **)(_o + 8);
    maxSize = *_a[1];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_0021ac7c:
      QNetworkReplyHttpImplPrivate::wantUploadDataSlot(pQVar8,maxSize);
      return;
    }
    break;
  case 0x19:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::sentUploadDataSlot
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1],*_a[2]);
      return;
    }
    break;
  case 0x1a:
    pQVar8 = *(QNetworkReplyHttpImplPrivate **)(_o + 8);
    if (pQVar8->uploadDeviceChoking == true) {
      pQVar8->uploadDeviceChoking = false;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        maxSize = 0x400;
        goto LAB_0021ac7c;
      }
      break;
    }
    goto switchD_0021a5aa_default;
  case 0x1b:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::emitReplyUploadProgress
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1],*_a[2]);
      return;
    }
    break;
  case 0x1c:
    *(undefined8 *)(*(long *)(_o + 8) + 0x2c8) = 0;
    goto switchD_0021a5aa_default;
  case 0x1d:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::_q_metaDataChanged(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
    break;
  case 0x1e:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::onRedirected
                (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QUrl *)_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0x1f:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QNetworkReplyHttpImplPrivate::followRedirect(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImpl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkReplyHttpImpl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->startHttpRequest(); break;
        case 1: _t->abortHttpRequest(); break;
        case 2: _t->readBufferSizeChanged((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 3: _t->readBufferFreed((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 4: _t->startHttpRequestSynchronously(); break;
        case 5: _t->haveUploadData((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[4]))); break;
        case 6: _t->d_func()->_q_startOperation(); break;
        case 7: _t->d_func()->_q_cacheLoadReadyRead(); break;
        case 8: _t->d_func()->_q_bufferOutgoingData(); break;
        case 9: _t->d_func()->_q_bufferOutgoingDataFinished(); break;
        case 10: _t->d_func()->_q_transferTimedOut(); break;
        case 11: _t->d_func()->_q_finished(); break;
        case 12: _t->d_func()->_q_error((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 13: _t->d_func()->replyDownloadData((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1]))); break;
        case 14: _t->d_func()->replyFinished(); break;
        case 15: _t->d_func()->replyDownloadProgressSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 16: _t->d_func()->httpAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 17: _t->d_func()->httpError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 18: _t->d_func()->replyEncrypted(); break;
        case 19: _t->d_func()->replySslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool*>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>*>>(_a[3]))); break;
        case 20: _t->d_func()->replySslConfigurationChanged((*reinterpret_cast< std::add_pointer_t<QSslConfiguration>>(_a[1]))); break;
        case 21: _t->d_func()->replyPreSharedKeyAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 22: _t->d_func()->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 23: _t->d_func()->resetUploadDataSlot((*reinterpret_cast< std::add_pointer_t<bool*>>(_a[1]))); break;
        case 24: _t->d_func()->wantUploadDataSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 25: _t->d_func()->sentUploadDataSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 26: _t->d_func()->uploadByteDeviceReadyReadSlot(); break;
        case 27: _t->d_func()->emitReplyUploadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 28: _t->d_func()->_q_cacheSaveDeviceAboutToClose(); break;
        case 29: _t->d_func()->_q_metaDataChanged(); break;
        case 30: _t->d_func()->onRedirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 31: _t->d_func()->followRedirect(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 12:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 16:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 17:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 19:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 20:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslConfiguration >(); break;
            }
            break;
        case 21:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 22:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)()>(_a, &QNetworkReplyHttpImpl::startHttpRequest, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)()>(_a, &QNetworkReplyHttpImpl::abortHttpRequest, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)(qint64 )>(_a, &QNetworkReplyHttpImpl::readBufferSizeChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)(qint64 )>(_a, &QNetworkReplyHttpImpl::readBufferFreed, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)()>(_a, &QNetworkReplyHttpImpl::startHttpRequestSynchronously, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)(const qint64 , const QByteArray & , bool , qint64 )>(_a, &QNetworkReplyHttpImpl::haveUploadData, 5))
            return;
    }
}